

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshEdit.cpp
# Opt level: O0

VertexIter __thiscall CMU462::HalfedgeMesh::collapseEdge(HalfedgeMesh *this,EdgeIter e)

{
  _List_node_base *p_Var1;
  bool bVar2;
  pointer this_00;
  HalfedgeIter *pHVar3;
  pointer pHVar4;
  VertexIter *pVVar5;
  reference pvVar6;
  pointer pVVar7;
  pointer v;
  EdgeIter *pEVar8;
  FaceIter *pFVar9;
  pointer pFVar10;
  reference p_Var11;
  reference p_Var12;
  reference p_Var13;
  _List_iterator<CMU462::Face> *fj;
  iterator __end1_3;
  iterator __begin1_3;
  vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
  *__range1_3;
  _List_iterator<CMU462::Edge> *ej;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
  *__range1_2;
  _List_iterator<CMU462::Halfedge> *hj_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  *__range1_1;
  _List_iterator<CMU462::Halfedge> *hj;
  iterator __end1;
  iterator __begin1;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  *__range1;
  FaceIter f_n_p1;
  FaceIter f_n;
  FaceIter f_1;
  FaceIter f_0;
  vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
  f_to_be_deleted;
  EdgeIter e_n;
  EdgeIter e_0;
  vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
  e_to_be_deleted;
  VertexIter v_n;
  VertexIter v_0;
  Vector3D local_138;
  Vector3D local_120;
  _List_node_base *local_108;
  HalfedgeIter h_last_next;
  HalfedgeIter h_last_prev;
  HalfedgeIter h_first_prev;
  HalfedgeIter h_last;
  HalfedgeIter h_first;
  HalfedgeIter h_1;
  HalfedgeIter h_n_twin;
  value_type h_n;
  HalfedgeIter h_0_twin;
  value_type h_0;
  HalfedgeIter hi;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  h_delete_vec;
  undefined1 local_88 [8];
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  h_to_be_deleted;
  VertexIter v_delete;
  HalfedgeIter h_twin;
  HalfedgeIter h;
  set<std::_List_iterator<CMU462::Edge>,_std::less<std::_List_iterator<CMU462::Edge>_>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
  local_50;
  HalfedgeMesh *local_20;
  HalfedgeMesh *this_local;
  EdgeIter e_local;
  VertexIter v_keep;
  
  local_20 = this;
  this_local = (HalfedgeMesh *)e._M_node;
  remove_tetrahedron(&local_50,this,e);
  std::
  set<std::_List_iterator<CMU462::Edge>,_std::less<std::_List_iterator<CMU462::Edge>_>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
  ::~set(&local_50);
  this_00 = std::_List_iterator<CMU462::Edge>::operator->
                      ((_List_iterator<CMU462::Edge> *)&this_local);
  pHVar3 = Edge::halfedge(this_00);
  h_twin._M_node = pHVar3->_M_node;
  pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->(&h_twin);
  pHVar3 = Halfedge::twin(pHVar4);
  v_delete._M_node = pHVar3->_M_node;
  pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->(&h_twin);
  pVVar5 = Halfedge::vertex(pHVar4);
  e_local._M_node = pVVar5->_M_node;
  pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->
                     ((_List_iterator<CMU462::Halfedge> *)&v_delete);
  pVVar5 = Halfedge::vertex(pHVar4);
  h_to_be_deleted.
  super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pVVar5->_M_node;
  std::
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::vector((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
            *)local_88);
  std::
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
               *)local_88,&h_twin);
  std::
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
               *)local_88,(value_type *)&v_delete);
  std::
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::vector((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
            *)&hi);
  h_0._M_node = v_delete._M_node;
  while( true ) {
    pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->(&h_0);
    pHVar3 = Halfedge::twin(pHVar4);
    pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->(pHVar3);
    pHVar3 = Halfedge::next(pHVar4);
    bVar2 = std::operator!=(pHVar3,(_Self *)&v_delete);
    if (!bVar2) break;
    pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->(&h_0);
    pHVar3 = Halfedge::twin(pHVar4);
    pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->(pHVar3);
    pHVar3 = Halfedge::next(pHVar4);
    h_0._M_node = pHVar3->_M_node;
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                 *)&hi,&h_0);
  }
  pvVar6 = std::
           vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
           ::front((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                    *)&hi);
  h_0_twin._M_node = pvVar6->_M_node;
  pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->(&h_0_twin);
  pHVar3 = Halfedge::twin(pHVar4);
  h_n._M_node = pHVar3->_M_node;
  pvVar6 = std::
           vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
           ::back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                   *)&hi);
  h_n_twin._M_node = pvVar6->_M_node;
  pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->(&h_n_twin);
  pHVar3 = Halfedge::twin(pHVar4);
  h_1._M_node = pHVar3->_M_node;
  pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->(&h_n);
  pHVar3 = Halfedge::next(pHVar4);
  p_Var1 = pHVar3->_M_node;
  h_last = h_twin;
  while( true ) {
    pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->(&h_last);
    pHVar3 = Halfedge::next(pHVar4);
    bVar2 = std::operator!=(pHVar3,&h_twin);
    if (!bVar2) break;
    pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->(&h_last);
    pHVar3 = Halfedge::next(pHVar4);
    h_last._M_node = pHVar3->_M_node;
  }
  pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->
                     ((_List_iterator<CMU462::Halfedge> *)&v_delete);
  pHVar3 = Halfedge::next(pHVar4);
  h_first_prev._M_node = pHVar3->_M_node;
  h_last_prev._M_node = p_Var1;
  while( true ) {
    pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->(&h_last_prev);
    pHVar3 = Halfedge::next(pHVar4);
    bVar2 = std::operator!=(pHVar3,&h_n);
    if (!bVar2) break;
    pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->(&h_last_prev);
    pHVar3 = Halfedge::next(pHVar4);
    h_last_prev._M_node = pHVar3->_M_node;
  }
  pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->(&h_n_twin);
  pHVar3 = Halfedge::next(pHVar4);
  h_last_next._M_node = pHVar3->_M_node;
  while( true ) {
    pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->(&h_last_next);
    pHVar3 = Halfedge::next(pHVar4);
    bVar2 = std::operator!=(pHVar3,&h_n_twin);
    if (!bVar2) break;
    pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->(&h_last_next);
    pHVar3 = Halfedge::next(pHVar4);
    h_last_next._M_node = pHVar3->_M_node;
  }
  pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->(&h_n_twin);
  pHVar3 = Halfedge::next(pHVar4);
  local_108 = pHVar3->_M_node;
  pVVar7 = std::_List_iterator<CMU462::Vertex>::operator->
                     ((_List_iterator<CMU462::Vertex> *)&e_local);
  v = std::_List_iterator<CMU462::Vertex>::operator->
                ((_List_iterator<CMU462::Vertex> *)
                 &h_to_be_deleted.
                  super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Vector3D::operator+(&local_138,&pVVar7->position,&v->position);
  v_0._M_node = (_List_node_base *)0x4000000000000000;
  Vector3D::operator/(&local_120,&local_138,(double *)&v_0);
  pVVar7 = std::_List_iterator<CMU462::Vertex>::operator->
                     ((_List_iterator<CMU462::Vertex> *)&e_local);
  (pVVar7->position).z = local_120.z;
  (pVVar7->position).x = local_120.x;
  (pVVar7->position).y = local_120.y;
  pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->(&h_n);
  pVVar5 = Halfedge::vertex(pHVar4);
  v_n._M_node = pVVar5->_M_node;
  pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->(&h_1);
  pVVar5 = Halfedge::vertex(pHVar4);
  e_to_be_deleted.
  super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pVVar5->_M_node;
  std::
  vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>::
  vector((vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
          *)&e_0);
  std::
  vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>::
  push_back((vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
             *)&e_0,(value_type *)&this_local);
  pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->(&h_0_twin);
  pEVar8 = Halfedge::edge(pHVar4);
  e_n._M_node = pEVar8->_M_node;
  pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->(&h_n_twin);
  pEVar8 = Halfedge::edge(pHVar4);
  f_to_be_deleted.
  super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pEVar8->_M_node;
  std::
  vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>::
  vector((vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
          *)&f_0);
  pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->(&h_twin);
  pFVar9 = Halfedge::face(pHVar4);
  f_1._M_node = pFVar9->_M_node;
  pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->(&h_n);
  pFVar9 = Halfedge::face(pHVar4);
  f_n._M_node = pFVar9->_M_node;
  pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->(&h_n_twin);
  pFVar9 = Halfedge::face(pHVar4);
  f_n_p1._M_node = pFVar9->_M_node;
  pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->
                     ((_List_iterator<CMU462::Halfedge> *)&v_delete);
  pFVar9 = Halfedge::face(pHVar4);
  __range1 = (vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
              *)pFVar9->_M_node;
  pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->(&h_0_twin);
  pHVar3 = Halfedge::next(pHVar4);
  bVar2 = std::operator==(pHVar3,&h_last);
  if (bVar2) {
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                 *)local_88,&h_0_twin);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                 *)local_88,&h_n);
    std::
    vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>::
    push_back((vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
               *)&e_0,&e_n);
    std::
    vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>::
    push_back((vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
               *)&f_0,&f_1);
    pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->(&h_first_prev);
    pHVar3 = Halfedge::next(pHVar4);
    bVar2 = std::operator==(pHVar3,&h_1);
    if ((bVar2) && (bVar2 = std::operator==(&f_n,&f_n_p1), bVar2)) {
      pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->(&h_last);
      pHVar3 = Halfedge::next(pHVar4);
      pHVar3->_M_node = h_first_prev._M_node;
    }
    else {
      pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->(&h_last);
      pHVar3 = Halfedge::next(pHVar4);
      pHVar3->_M_node = p_Var1;
    }
    pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->(&h_last);
    pFVar9 = Halfedge::face(pHVar4);
    pFVar9->_M_node = f_n._M_node;
    pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->(&h_last_prev);
    pHVar3 = Halfedge::next(pHVar4);
    pHVar3->_M_node = h_last._M_node;
    pVVar7 = std::_List_iterator<CMU462::Vertex>::operator->(&v_n);
    pHVar3 = Vertex::halfedge(pVVar7);
    pHVar3->_M_node = h_last._M_node;
    pFVar10 = std::_List_iterator<CMU462::Face>::operator->(&f_n);
    pHVar3 = Face::halfedge(pFVar10);
    pHVar3->_M_node = h_last._M_node;
  }
  else {
    pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->(&h_last);
    pHVar3 = Halfedge::next(pHVar4);
    pHVar3->_M_node = h_0_twin._M_node;
    pFVar10 = std::_List_iterator<CMU462::Face>::operator->(&f_1);
    pHVar3 = Face::halfedge(pFVar10);
    pHVar3->_M_node = h_0_twin._M_node;
  }
  __end1 = std::
           vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
           ::begin((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                    *)&hi);
  hj = (_List_iterator<CMU462::Halfedge> *)
       std::
       vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
       ::end((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
              *)&hi);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::_List_iterator<CMU462::Halfedge>_*,_std::vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>_>
                                     *)&hj), bVar2) {
    p_Var11 = __gnu_cxx::
              __normal_iterator<std::_List_iterator<CMU462::Halfedge>_*,_std::vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>_>
              ::operator*(&__end1);
    pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->(p_Var11);
    pVVar5 = Halfedge::vertex(pHVar4);
    pVVar5->_M_node = e_local._M_node;
    __gnu_cxx::
    __normal_iterator<std::_List_iterator<CMU462::Halfedge>_*,_std::vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>_>
    ::operator++(&__end1);
  }
  pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->(&h_first_prev);
  pHVar3 = Halfedge::next(pHVar4);
  bVar2 = std::operator==(pHVar3,&h_1);
  if (bVar2) {
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                 *)local_88,&h_n_twin);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                 *)local_88,&h_1);
    std::
    vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>::
    push_back((vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
               *)&e_0,(value_type *)
                      &f_to_be_deleted.
                       super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>::
    push_back((vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
               *)&f_0,(value_type *)&__range1);
    pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->(&h_first_prev);
    pHVar3 = Halfedge::next(pHVar4);
    pHVar3->_M_node = local_108;
    pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->(&h_first_prev);
    pFVar9 = Halfedge::face(pHVar4);
    pFVar9->_M_node = f_n_p1._M_node;
    pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->(&h_last_next);
    pHVar3 = Halfedge::next(pHVar4);
    pHVar3->_M_node = h_first_prev._M_node;
    pVVar7 = std::_List_iterator<CMU462::Vertex>::operator->
                       ((_List_iterator<CMU462::Vertex> *)
                        &e_to_be_deleted.
                         super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pHVar3 = Vertex::halfedge(pVVar7);
    pHVar3->_M_node = local_108;
    pFVar10 = std::_List_iterator<CMU462::Face>::operator->(&f_n_p1);
    pHVar3 = Face::halfedge(pFVar10);
    pHVar3->_M_node = h_first_prev._M_node;
  }
  else {
    pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->(&h_1);
    pHVar3 = Halfedge::next(pHVar4);
    pHVar3->_M_node = h_first_prev._M_node;
    pFVar10 = std::_List_iterator<CMU462::Face>::operator->
                        ((_List_iterator<CMU462::Face> *)&__range1);
    pHVar3 = Face::halfedge(pFVar10);
    pHVar3->_M_node = h_first_prev._M_node;
  }
  pVVar7 = std::_List_iterator<CMU462::Vertex>::operator->
                     ((_List_iterator<CMU462::Vertex> *)&e_local);
  pHVar3 = Vertex::halfedge(pVVar7);
  pHVar3->_M_node = h_first_prev._M_node;
  __end1_1 = std::
             vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             ::begin((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                      *)local_88);
  hj_1 = (_List_iterator<CMU462::Halfedge> *)
         std::
         vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
         ::end((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                *)local_88);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<std::_List_iterator<CMU462::Halfedge>_*,_std::vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>_>
                             *)&hj_1), bVar2) {
    p_Var11 = __gnu_cxx::
              __normal_iterator<std::_List_iterator<CMU462::Halfedge>_*,_std::vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>_>
              ::operator*(&__end1_1);
    deleteHalfedge(this,p_Var11->_M_node);
    __gnu_cxx::
    __normal_iterator<std::_List_iterator<CMU462::Halfedge>_*,_std::vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>_>
    ::operator++(&__end1_1);
  }
  deleteVertex(this,(VertexIter)
                    h_to_be_deleted.
                    super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  __end1_2 = std::
             vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
             ::begin((vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                      *)&e_0);
  ej = (_List_iterator<CMU462::Edge> *)
       std::
       vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
       ::end((vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
              *)&e_0);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_2,
                            (__normal_iterator<std::_List_iterator<CMU462::Edge>_*,_std::vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>_>
                             *)&ej), bVar2) {
    p_Var12 = __gnu_cxx::
              __normal_iterator<std::_List_iterator<CMU462::Edge>_*,_std::vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>_>
              ::operator*(&__end1_2);
    deleteEdge(this,p_Var12->_M_node);
    __gnu_cxx::
    __normal_iterator<std::_List_iterator<CMU462::Edge>_*,_std::vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>_>
    ::operator++(&__end1_2);
  }
  __end1_3 = std::
             vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
             ::begin((vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                      *)&f_0);
  fj = (_List_iterator<CMU462::Face> *)
       std::
       vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
       ::end((vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
              *)&f_0);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_3,
                            (__normal_iterator<std::_List_iterator<CMU462::Face>_*,_std::vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>_>
                             *)&fj), bVar2) {
    p_Var13 = __gnu_cxx::
              __normal_iterator<std::_List_iterator<CMU462::Face>_*,_std::vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>_>
              ::operator*(&__end1_3);
    deleteFace(this,p_Var13->_M_node);
    __gnu_cxx::
    __normal_iterator<std::_List_iterator<CMU462::Face>_*,_std::vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>_>
    ::operator++(&__end1_3);
  }
  std::
  vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>::
  ~vector((vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
           *)&f_0);
  std::
  vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>::
  ~vector((vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
           *)&e_0);
  std::
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::~vector((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             *)&hi);
  std::
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  ::~vector((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             *)local_88);
  return (VertexIter)e_local._M_node;
}

Assistant:

VertexIter HalfedgeMesh::collapseEdge(EdgeIter e) {
  // This method should collapse the given edge and return an iterator to
  // the new vertex created by the collapse.

  remove_tetrahedron(e);

  auto h = e->halfedge(), h_twin = h->twin();
  auto v_keep = h->vertex(), v_delete = h_twin->vertex();

  // Collect
  // HalfEdges
  vector<HalfedgeIter> h_to_be_deleted;
  h_to_be_deleted.push_back(h);
  h_to_be_deleted.push_back(h_twin);

  vector<HalfedgeIter> h_delete_vec;
  auto hi = h_twin;
  while (hi->twin()->next() != h_twin) {
    hi = hi->twin()->next();
    h_delete_vec.push_back(hi);
  }
  auto h_0 = h_delete_vec.front(), h_0_twin = h_0->twin(),
       h_n = h_delete_vec.back(), h_n_twin = h_n->twin(),
       h_1 = h_0_twin->next();

  auto h_first = h;
  while (h_first->next() != h) {
    h_first = h_first->next();
  }
  auto h_last = h_twin->next();
  auto h_first_prev = h_1;
  while (h_first_prev->next() != h_0_twin) {
    h_first_prev = h_first_prev->next();
  }
  auto h_last_prev = h_n->next();
  while (h_last_prev->next() != h_n) {
    h_last_prev = h_last_prev->next();
  }
  auto h_last_next = h_n->next();

  // Vertices
  v_keep->position = (v_keep->position + v_delete->position) / 2;
  auto v_0 = h_0_twin->vertex(), v_n = h_n_twin->vertex();

  // Edges
  vector<EdgeIter> e_to_be_deleted;
  e_to_be_deleted.push_back(e);
  auto e_0 = h_0->edge(), e_n = h_n->edge();

  // Faces
  vector<FaceIter> f_to_be_deleted;
  auto f_0 = h->face(),
       f_1 = h_0_twin->face(),
       f_n = h_n->face(),
       f_n_p1 = h_twin->face();

  // Reassign
  if (h_0->next() == h_first) {
    h_to_be_deleted.push_back(h_0);
    h_to_be_deleted.push_back(h_0_twin);
    e_to_be_deleted.push_back(e_0);
    f_to_be_deleted.push_back(f_0);

    // HalfEdges
    // We have a corner case here: when the faces on either side of the edge have a degree of 3,
    // while the vertex to be deleted also has a degree of 3. We have to deal with this carefully.
    if (h_last->next() == h_n_twin && f_1 == f_n) {
      h_first->next() = h_last;
    } else {
      h_first->next() = h_1;
    }
    h_first->face() = f_1;
    h_first_prev->next() = h_first;

    // Vertices
    v_0->halfedge() = h_first;

    // Faces
    f_1->halfedge() = h_first;
  } else {
    h_first->next() = h_0;
    f_0->halfedge() = h_0;
  }
  for (auto& hj : h_delete_vec) {
    hj->vertex() = v_keep;
  }
  if (h_last->next() == h_n_twin) {
    h_to_be_deleted.push_back(h_n);
    h_to_be_deleted.push_back(h_n_twin);
    e_to_be_deleted.push_back(e_n);
    f_to_be_deleted.push_back(f_n_p1);

    // HalfEdges
    h_last->next() = h_last_next;
    h_last->face() = f_n;
    h_last_prev->next() = h_last;

    // Vertices
    v_n->halfedge() = h_last_next;

    // Faces
    f_n->halfedge() = h_last;
  } else {
    h_n_twin->next() = h_last;
    f_n_p1->halfedge() = h_last;
  }
  v_keep->halfedge() = h_last;

  // Delete
  for (auto& hj : h_to_be_deleted) {
    deleteHalfedge(hj);
  }
  deleteVertex(v_delete);
  for (auto& ej : e_to_be_deleted) {
    deleteEdge(ej);
  }
  for (auto& fj : f_to_be_deleted) {
    deleteFace(fj);
  }

  return v_keep;
}